

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArrayBuffer.h
# Opt level: O3

void __thiscall
Js::ProjectionArrayBuffer::MarshalToScriptContext
          (ProjectionArrayBuffer *this,ScriptContext *scriptContext)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  
  if ((((((this->super_ArrayBuffer).super_ArrayBufferBase.super_DynamicObject.super_RecyclableObject
          .type.ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).scriptContext.ptr ==
      scriptContext) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Library/ArrayBuffer.h"
                                ,0x16e,"(this->GetScriptContext() != scriptContext)",
                                "this->GetScriptContext() != scriptContext");
    if (!bVar2) goto LAB_00b22b26;
    *puVar3 = 0;
  }
  if ((this->super_ArrayBuffer).super_ArrayBufferBase.super_DynamicObject.super_RecyclableObject.
      super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject !=
      (_func_int **)VirtualTableInfo<Js::ProjectionArrayBuffer>::Address) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Library/ArrayBuffer.h"
                                ,0x16e,
                                "(VirtualTableInfo<ProjectionArrayBuffer>::HasVirtualTable(this))",
                                "Derived class need to define marshal to script context");
    if (!bVar2) {
LAB_00b22b26:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  (this->super_ArrayBuffer).super_ArrayBufferBase.super_DynamicObject.super_RecyclableObject.
  super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject =
       (_func_int **)VirtualTableInfo<Js::CrossSiteObject<Js::ProjectionArrayBuffer>_>::Address;
  return;
}

Assistant:

virtual ArrayBufferDetachedStateBase* CreateDetachedState(RefCountedBuffer * content, DECLSPEC_GUARD_OVERFLOW uint32 bufferLength) override
        {
            return HeapNew(ArrayBufferDetachedState<FreeFn>, content, bufferLength, CoTaskMemFree, GetScriptContext()->GetRecycler(), ArrayBufferAllocationType::CoTask);
        }